

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

xml_parse_result * __thiscall
pugi::xml_document::load_buffer_inplace
          (xml_parse_result *__return_storage_ptr__,xml_document *this,void *contents,size_t size,
          uint options,xml_encoding encoding)

{
  xml_document_struct *doc;
  
  reset(this);
  doc = (xml_document_struct *)(this->super_xml_node)._root;
  impl::anon_unknown_0::load_buffer_impl
            (__return_storage_ptr__,doc,(xml_node_struct *)doc,contents,size,options,encoding,true,
             false,&this->_buffer);
  return __return_storage_ptr__;
}

Assistant:

PUGI_IMPL_FN xml_parse_result xml_document::load_buffer_inplace(void* contents, size_t size, unsigned int options, xml_encoding encoding)
	{
		reset();

		return impl::load_buffer_impl(static_cast<impl::xml_document_struct*>(_root), _root, contents, size, options, encoding, true, false, &_buffer);
	}